

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   HighsInt value)

{
  HighsOptionType HVar1;
  OptionRecordDouble *option;
  OptionStatus OVar2;
  undefined8 in_RAX;
  HighsInt index;
  
  index = (HighsInt)((ulong)in_RAX >> 0x20);
  OVar2 = getOptionIndex(report_log_options,name,option_records,&index);
  if (OVar2 == kOk) {
    option = (OptionRecordDouble *)
             (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
             _M_impl.super__Vector_impl_data._M_start[index];
    HVar1 = (option->super_OptionRecord).type;
    if (HVar1 == kInt) {
      OVar2 = setLocalOptionValue(report_log_options,(OptionRecordInt *)option,value);
      return OVar2;
    }
    if (HVar1 == kDouble) {
      OVar2 = setLocalOptionValue(report_log_options,option,(double)value);
      return OVar2;
    }
    highsLogUser(report_log_options,kError,
                 "setLocalOptionValue: Option \"%s\" cannot be assigned an int\n",
                 (name->_M_dataplus)._M_p);
    OVar2 = kIllegalValue;
  }
  else {
    OVar2 = kUnknownOption;
  }
  return OVar2;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 std::vector<OptionRecord*>& option_records,
                                 const HighsInt value) {
  HighsInt index;
  //  printf("setLocalOptionValue: \"%s\" with HighsInt %" HIGHSINT_FORMAT "\n",
  //  name.c_str(), value);
  OptionStatus status =
      getOptionIndex(report_log_options, name, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kInt) {
    if (type == HighsOptionType::kDouble) {
      // Interpret integer as double
      double use_value = value;
      return setLocalOptionValue(
          report_log_options, ((OptionRecordDouble*)option_records[index])[0],
          use_value);
    }
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "setLocalOptionValue: Option \"%s\" cannot be assigned an int\n",
        name.c_str());
    return OptionStatus::kIllegalValue;
  }
  return setLocalOptionValue(
      report_log_options, ((OptionRecordInt*)option_records[index])[0], value);
}